

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_cmdline_handle_short_opt_group_
              (ACUTEST_CMDLINE_OPTION_ *options,char *arggroup,_func_int_int_char_ptr *callback)

{
  code *in_RDX;
  long in_RSI;
  char *in_RDI;
  undefined8 uVar1;
  char badoptname [3];
  int ret;
  int i;
  ACUTEST_CMDLINE_OPTION_ *opt;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  int local_28;
  int local_24;
  char *local_20;
  code *local_18;
  long local_10;
  char *local_8;
  
  local_28 = 0;
  local_24 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (*(char *)(local_10 + local_24) == '\0') {
      return local_28;
    }
    for (local_20 = local_8;
        (*(int *)(local_20 + 0x10) != 0 && (*(char *)(local_10 + local_24) != *local_20));
        local_20 = local_20 + 0x18) {
    }
    if ((*(int *)(local_20 + 0x10) == 0) || ((*(uint *)(local_20 + 0x14) & 2) != 0)) {
      local_2b = 0x2d;
      local_2a = *(undefined1 *)(local_10 + local_24);
      local_29 = 0;
      uVar1 = 0x80000001;
      if (*(int *)(local_20 + 0x10) != 0) {
        uVar1 = 0x80000002;
      }
      local_28 = (*local_18)(uVar1,&local_2b);
    }
    else {
      local_28 = (*local_18)(*(undefined4 *)(local_20 + 0x10),0);
    }
    if (local_28 != 0) break;
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

static int
acutest_cmdline_handle_short_opt_group_(const ACUTEST_CMDLINE_OPTION_* options,
                    const char* arggroup,
                    int (*callback)(int /*optval*/, const char* /*arg*/))
{
    const ACUTEST_CMDLINE_OPTION_* opt;
    int i;
    int ret = 0;

    for(i = 0; arggroup[i] != '\0'; i++) {
        for(opt = options; opt->id != 0; opt++) {
            if(arggroup[i] == opt->shortname)
                break;
        }

        if(opt->id != 0  &&  !(opt->flags & ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_)) {
            ret = callback(opt->id, NULL);
        } else {
            /* Unknown option. */
            char badoptname[3];
            badoptname[0] = '-';
            badoptname[1] = arggroup[i];
            badoptname[2] = '\0';
            ret = callback((opt->id != 0 ? ACUTEST_CMDLINE_OPTID_MISSINGARG_ : ACUTEST_CMDLINE_OPTID_UNKNOWN_),
                            badoptname);
        }

        if(ret != 0)
            break;
    }

    return ret;
}